

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int readJournalHdr(Pager *pPager,int isHot,i64 journalSize,u32 *pNRec,u32 *pDbSize)

{
  int iVar1;
  i64 iVar2;
  long in_RDX;
  int in_ESI;
  Pager *in_RDI;
  Pager *in_R8;
  u32 iSectorSize;
  u32 iPageSize;
  i64 iHdrOff;
  uchar aMagic [8];
  int rc;
  i64 in_stack_ffffffffffffffa8;
  u32 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  void *pBuf;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  uint in_stack_ffffffffffffffc8;
  
  iVar2 = journalHdrOffset(in_RDI);
  in_RDI->journalOff = iVar2;
  if (in_RDX < (long)(in_RDI->journalOff + (ulong)in_RDI->sectorSize)) {
    return 0x65;
  }
  pBuf = (void *)in_RDI->journalOff;
  if ((in_ESI != 0) || (pBuf != (void *)in_RDI->journalHdr)) {
    iVar1 = sqlite3OsRead((sqlite3_file *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),pBuf,
                          in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
    if (iVar1 != 0) {
      return iVar1;
    }
    if (CONCAT44(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4) != -0x289c5edf06fa2a27) {
      return 0x65;
    }
  }
  iVar1 = read32bits((sqlite3_file *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (i64)pBuf,(u32 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0))
  ;
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = read32bits((sqlite3_file *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (i64)pBuf,(u32 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0))
  ;
  if (iVar1 == 0) {
    iVar1 = read32bits((sqlite3_file *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                       ,(i64)pBuf,
                       (u32 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = 0;
    if (in_RDI->journalOff == 0) {
      iVar1 = read32bits((sqlite3_file *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),(i64)pBuf,
                         (u32 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = read32bits((sqlite3_file *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),(i64)pBuf,
                         (u32 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      if (iVar1 != 0) {
        return iVar1;
      }
      if (in_stack_ffffffffffffffb4 == 0) {
        in_stack_ffffffffffffffb4 = in_RDI->pageSize;
      }
      if ((((in_stack_ffffffffffffffb4 < 0x200) || (in_stack_ffffffffffffffb0 < 0x20)) ||
          (0x10000 < in_stack_ffffffffffffffb4)) ||
         (((0x10000 < in_stack_ffffffffffffffb0 ||
           ((in_stack_ffffffffffffffb4 - 1 & in_stack_ffffffffffffffb4) != 0)) ||
          ((in_stack_ffffffffffffffb0 - 1 & in_stack_ffffffffffffffb0) != 0)))) {
        return 0x65;
      }
      iVar1 = sqlite3PagerSetPagesize
                        (in_R8,(u32 *)(ulong)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
      in_RDI->sectorSize = in_stack_ffffffffffffffb0;
    }
    in_RDI->journalOff = (ulong)in_RDI->sectorSize + in_RDI->journalOff;
    return iVar1;
  }
  return iVar1;
}

Assistant:

static int readJournalHdr(
  Pager *pPager,               /* Pager object */
  int isHot,
  i64 journalSize,             /* Size of the open journal file in bytes */
  u32 *pNRec,                  /* OUT: Value read from the nRec field */
  u32 *pDbSize                 /* OUT: Value of original database size field */
){
  int rc;                      /* Return code */
  unsigned char aMagic[8];     /* A buffer to hold the magic header */
  i64 iHdrOff;                 /* Offset of journal header being read */

  assert( isOpen(pPager->jfd) );      /* Journal file must be open. */

  /* Advance Pager.journalOff to the start of the next sector. If the
  ** journal file is too small for there to be a header stored at this
  ** point, return SQLITE_DONE.
  */
  pPager->journalOff = journalHdrOffset(pPager);
  if( pPager->journalOff+JOURNAL_HDR_SZ(pPager) > journalSize ){
    return SQLITE_DONE;
  }
  iHdrOff = pPager->journalOff;

  /* Read in the first 8 bytes of the journal header. If they do not match
  ** the  magic string found at the start of each journal header, return
  ** SQLITE_DONE. If an IO error occurs, return an error code. Otherwise,
  ** proceed.
  */
  if( isHot || iHdrOff!=pPager->journalHdr ){
    rc = sqlite3OsRead(pPager->jfd, aMagic, sizeof(aMagic), iHdrOff);
    if( rc ){
      return rc;
    }
    if( memcmp(aMagic, aJournalMagic, sizeof(aMagic))!=0 ){
      return SQLITE_DONE;
    }
  }

  /* Read the first three 32-bit fields of the journal header: The nRec
  ** field, the checksum-initializer and the database size at the start
  ** of the transaction. Return an error code if anything goes wrong.
  */
  if( SQLITE_OK!=(rc = read32bits(pPager->jfd, iHdrOff+8, pNRec))
   || SQLITE_OK!=(rc = read32bits(pPager->jfd, iHdrOff+12, &pPager->cksumInit))
   || SQLITE_OK!=(rc = read32bits(pPager->jfd, iHdrOff+16, pDbSize))
  ){
    return rc;
  }

  if( pPager->journalOff==0 ){
    u32 iPageSize;               /* Page-size field of journal header */
    u32 iSectorSize;             /* Sector-size field of journal header */

    /* Read the page-size and sector-size journal header fields. */
    if( SQLITE_OK!=(rc = read32bits(pPager->jfd, iHdrOff+20, &iSectorSize))
     || SQLITE_OK!=(rc = read32bits(pPager->jfd, iHdrOff+24, &iPageSize))
    ){
      return rc;
    }

    /* Versions of SQLite prior to 3.5.8 set the page-size field of the
    ** journal header to zero. In this case, assume that the Pager.pageSize
    ** variable is already set to the correct page size.
    */
    if( iPageSize==0 ){
      iPageSize = pPager->pageSize;
    }

    /* Check that the values read from the page-size and sector-size fields
    ** are within range. To be 'in range', both values need to be a power
    ** of two greater than or equal to 512 or 32, and not greater than their 
    ** respective compile time maximum limits.
    */
    if( iPageSize<512                  || iSectorSize<32
     || iPageSize>SQLITE_MAX_PAGE_SIZE || iSectorSize>MAX_SECTOR_SIZE
     || ((iPageSize-1)&iPageSize)!=0   || ((iSectorSize-1)&iSectorSize)!=0 
    ){
      /* If the either the page-size or sector-size in the journal-header is 
      ** invalid, then the process that wrote the journal-header must have 
      ** crashed before the header was synced. In this case stop reading 
      ** the journal file here.
      */
      return SQLITE_DONE;
    }

    /* Update the page-size to match the value read from the journal. 
    ** Use a testcase() macro to make sure that malloc failure within 
    ** PagerSetPagesize() is tested.
    */
    rc = sqlite3PagerSetPagesize(pPager, &iPageSize, -1);
    testcase( rc!=SQLITE_OK );

    /* Update the assumed sector-size to match the value used by 
    ** the process that created this journal. If this journal was
    ** created by a process other than this one, then this routine
    ** is being called from within pager_playback(). The local value
    ** of Pager.sectorSize is restored at the end of that routine.
    */
    pPager->sectorSize = iSectorSize;
  }

  pPager->journalOff += JOURNAL_HDR_SZ(pPager);
  return rc;
}